

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool server::setmaster(clientinfo *ci,bool val,char *pass,char *authname,char *authdesc,int authpriv
                      ,bool force,bool trial)

{
  long lVar1;
  clientinfo *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *fmt;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  string msg;
  packetbuf local_168;
  uchar local_138 [264];
  
  if (authname != (char *)0x0 && !val) {
    return false;
  }
  if (val) {
    if (*adminpass != '\0') {
      hashpassword(ci->clientnum,ci->sessionid,adminpass,(char *)local_138,0x104);
      iVar4 = strcmp((char *)local_138,pass);
      if (iVar4 == 0) {
        authpriv = 3;
      }
    }
    iVar4 = 3;
    if (ci->local == false) {
      iVar4 = authpriv;
    }
    bVar9 = true;
    pcVar8 = "";
    if (ci->privilege < iVar4) {
      if (iVar4 < 2 && !force) {
        if ((ci->state).state == 5) {
          iVar4 = ci->clientnum;
          pcVar7 = "Spectators may not claim master.";
        }
        else {
          if ((enablemultiplemasters == 0) && (0 < (long)DAT_00194834)) {
            lVar6 = 0;
            do {
              pcVar2 = *(clientinfo **)(clients + lVar6 * 8);
              if ((pcVar2 != ci) && (pcVar2->privilege != 0)) {
                iVar4 = ci->clientnum;
                pcVar7 = "\f3Error: Someone already has privileges";
                goto LAB_001387f0;
              }
              lVar6 = lVar6 + 1;
            } while (DAT_00194834 != lVar6);
          }
          if ((((authname != (char *)0x0) || ((mastermask._1_1_ & 0x10) != 0)) ||
              (ci->privilege != 0)) || (ci->local != false)) goto LAB_001388a3;
          iVar4 = ci->clientnum;
          pcVar7 = "This server requires you to use the \"/auth\" command to claim master.";
        }
LAB_001387f0:
        bVar9 = false;
        sendf(iVar4,1,"ris",0x23,pcVar7);
        goto LAB_001388ac;
      }
LAB_001388a3:
      if (trial) goto LAB_001388ac;
      ci->privilege = iVar4;
      bVar3 = true;
      if (iVar4 == 1) {
        pcVar8 = "\f0master";
      }
      else if (iVar4 == 3) {
        pcVar8 = "\f6admin";
      }
      else if (iVar4 == 2) {
        pcVar8 = "\f8auth";
      }
      else {
        pcVar8 = "\f1unknown";
      }
      bVar9 = false;
    }
    else {
LAB_001388ac:
      bVar3 = false;
    }
    if (!bVar3) {
      return bVar9;
    }
  }
  else {
    iVar4 = ci->privilege;
    if (iVar4 == 0 || trial) {
      return iVar4 != 0;
    }
    if (iVar4 - 1U < 3) {
      pcVar8 = (&PTR_anon_var_dwarf_37d71_001826a0)[iVar4 - 1U];
    }
    else {
      pcVar8 = "\f1unknown";
    }
    ci->privilege = 0;
    if (((ci->state).state == 5) && (ci->local == false)) {
      aiman::removeai(ci);
    }
  }
  if ((long)DAT_00194834 < 1) {
LAB_001388f4:
    mastermode = 0;
    _DAT_00194b5c = 0;
  }
  else {
    lVar6 = 0;
    bVar9 = false;
    do {
      lVar1 = *(long *)(clients + lVar6 * 8);
      if ((*(char *)(lVar1 + 0x339) != '\0') || (0 < *(int *)(lVar1 + 0x334))) {
        bVar9 = true;
      }
      lVar6 = lVar6 + 1;
    } while (DAT_00194834 != lVar6);
    if (!bVar9) goto LAB_001388f4;
  }
  if (val && authname != (char *)0x0) {
    if ((authdesc != (char *)0x0) && (*authdesc != '\0')) {
      local_168.super_ucharbuf.buf = local_138;
      pcVar7 = colorname(ci);
      stringformatter::operator()
                ((stringformatter *)&local_168,
                 "\f0%s \f7claimed \f6%s \f7as \'\fs\f5%s\fr\' [\fs\f0%s\fr]",pcVar7,pcVar8,authname
                 ,authdesc);
      goto LAB_001389b8;
    }
    local_168.super_ucharbuf.buf = local_138;
    pcVar5 = colorname(ci);
    fmt = "\f0%s \f7claimed %s \f7as \'\fs\f5%s\fr\'";
    pcVar7 = pcVar8;
    pcVar8 = authname;
  }
  else {
    local_168.super_ucharbuf.buf = local_138;
    pcVar5 = colorname(ci);
    pcVar7 = "relinquished";
    if (val) {
      pcVar7 = "claimed";
    }
    fmt = "\f0%s \f7%s %s";
  }
  stringformatter::operator()((stringformatter *)&local_168,fmt,pcVar5,pcVar7,pcVar8);
LAB_001389b8:
  local_168.super_ucharbuf.buf = (uchar *)0x0;
  local_168.super_ucharbuf.len = 0;
  local_168.super_ucharbuf.maxlen = 0;
  local_168.super_ucharbuf.flags = '\0';
  local_168.growth = 5000;
  local_168.packet = enet_packet_create((void *)0x0,5000,1);
  local_168.super_ucharbuf.buf = (local_168.packet)->data;
  local_168.super_ucharbuf.maxlen = (int)(local_168.packet)->dataLength;
  putint(&local_168,0x23);
  sendstring((char *)local_138,&local_168);
  putint(&local_168,0x3d);
  putint(&local_168,mastermode);
  if (0 < DAT_00194834) {
    lVar6 = 0;
    do {
      lVar1 = *(long *)(clients + lVar6 * 8);
      if (0 < *(int *)(lVar1 + 0x334)) {
        putint(&local_168,*(int *)(lVar1 + 8));
        putint(&local_168,*(int *)(*(long *)(clients + lVar6 * 8) + 0x334));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < DAT_00194834);
  }
  putint(&local_168,-1);
  enet_packet_resize(local_168.packet,(long)local_168.super_ucharbuf.len);
  local_168.super_ucharbuf.buf = (local_168.packet)->data;
  local_168.super_ucharbuf.maxlen = (int)(local_168.packet)->dataLength;
  sendpacket(-1,1,local_168.packet,-1);
  checkpausegame();
  if (((0 < local_168.growth) && (local_168.packet != (ENetPacket *)0x0)) &&
     ((local_168.packet)->referenceCount == 0)) {
    enet_packet_destroy(local_168.packet);
  }
  return true;
}

Assistant:

bool setmaster(clientinfo *ci, bool val, const char *pass = "", const char *authname = NULL, const char *authdesc = NULL, int authpriv = PRIV_MASTER, bool force = false, bool trial = false)
    {
        if(authname && !val) return false;
        const char *name = "";
        if(val)
        {
            bool haspass = adminpass[0] && checkpassword(ci, adminpass, pass);
            int wantpriv = ci->local || haspass ? PRIV_ADMIN : authpriv;
            if(wantpriv <= ci->privilege) return true;
            else if(wantpriv <= PRIV_MASTER && !force)
            {
                if(ci->state.state==CS_SPECTATOR)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "Spectators may not claim master.");
                    return false;
                }
                if(!enablemultiplemasters) {
                    loopv(clients) if(ci!=clients[i] && clients[i]->privilege)
                    {
                        sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Someone already has privileges");
                        return false;
                    }
                }
                if(!authname && !(mastermask&MM_AUTOAPPROVE) && !ci->privilege && !ci->local)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "This server requires you to use the \"/auth\" command to claim master.");
                    return false;
                }
            }
            if(trial) return true;
            ci->privilege = wantpriv;
            name = privname(ci->privilege);
        }
        else
        {
            if(!ci->privilege) return false;
            if(trial) return true;
            name = privname(ci->privilege);
            revokemaster(ci);
        }
        bool hasmaster = false;
        loopv(clients) if(clients[i]->local || clients[i]->privilege >= PRIV_MASTER) hasmaster = true;
        if(!hasmaster)
        {
            mastermode = MM_OPEN;
            allowedips.shrink(0);
        }
        string msg;
        if(val && authname)
        {
            if(authdesc && authdesc[0]) formatstring(msg)("\f0%s \f7claimed \f6%s \f7as '\fs\f5%s\fr' [\fs\f0%s\fr]", colorname(ci), name, authname, authdesc);
            else formatstring(msg)("\f0%s \f7claimed %s \f7as '\fs\f5%s\fr'", colorname(ci), name, authname);
        }
        else formatstring(msg)("\f0%s \f7%s %s", colorname(ci), val ? "claimed" : "relinquished", name);
        packetbuf p(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
        putint(p, N_SERVMSG);
        sendstring(msg, p);
        putint(p, N_CURRENTMASTER);
        putint(p, mastermode);
        loopv(clients) if(clients[i]->privilege >= PRIV_MASTER)
        {
            putint(p, clients[i]->clientnum);
            putint(p, clients[i]->privilege);
        }
        putint(p, -1);
        sendpacket(-1, 1, p.finalize());
        checkpausegame();
        return true;
    }